

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetic.h
# Opt level: O2

vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *
FastPForLib::generateArray32
          (vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
           *__return_storage_ptr__,uint32_t N,uint32_t mask)

{
  uint uVar1;
  size_t k;
  ulong uVar2;
  allocator_type local_21;
  
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::vector
            (__return_storage_ptr__,(ulong)N,&local_21);
  for (uVar2 = 0; N != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = rand();
    (__return_storage_ptr__->
    super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>)._M_impl
    .super__Vector_impl_data._M_start[uVar2] = uVar1 & mask;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t, cacheallocator>
generateArray32(uint32_t N, const uint32_t mask = 0xFFFFFFFFU) {
  std::vector<uint32_t, cacheallocator> ans(N);
  for (size_t k = 0; k < N; ++k)
    ans[k] = rand() & mask;
  return ans;
}